

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall S2Builder::set_label(S2Builder *this,Label label)

{
  S2LogMessage local_20;
  
  if (-1 < label) {
    std::vector<int,_std::allocator<int>_>::resize(&this->label_set_,1);
    *(this->label_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = label;
    this->label_set_modified_ = true;
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x131,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_20.stream_,"Check failed: (label) >= (0) ");
  abort();
}

Assistant:

void S2Builder::set_label(Label label) {
  S2_DCHECK_GE(label, 0);
  label_set_.resize(1);
  label_set_[0] = label;
  label_set_modified_ = true;
}